

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O0

void __thiscall
ROM::Description::
Description<std::initializer_list<std::__cxx11::string>,std::initializer_list<unsigned_int>>
          (Description *this,Name name,string *machine_name,string *descriptive_name,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          file_names,size_t size,initializer_list<unsigned_int> crc32s)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  size_type sVar1;
  reference puVar2;
  bool bVar3;
  _Rb_tree_const_iterator<unsigned_int> local_88;
  allocator<unsigned_int> local_7a;
  less<unsigned_int> local_79;
  iterator local_78;
  size_type sStack_70;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_59;
  Description *local_58;
  iterator pbStack_50;
  string *local_38;
  string *descriptive_name_local;
  string *machine_name_local;
  Description *pDStack_20;
  Name name_local;
  Description *this_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  file_names_local;
  
  file_names_local._M_array = (iterator)file_names._M_len;
  this_local = (Description *)file_names._M_array;
  this->name = name;
  local_38 = descriptive_name;
  descriptive_name_local = machine_name;
  machine_name_local._4_4_ = name;
  pDStack_20 = this;
  std::__cxx11::string::string((string *)&this->machine_name,(string *)machine_name);
  std::__cxx11::string::string((string *)&this->descriptive_name,(string *)descriptive_name);
  local_58 = this_local;
  pbStack_50 = file_names_local._M_array;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_59);
  __l_00._M_len = (size_type)pbStack_50;
  __l_00._M_array = (iterator)local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names,__l_00,&local_59);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_59);
  this->size = size;
  local_78 = crc32s._M_array;
  sStack_70 = crc32s._M_len;
  std::allocator<unsigned_int>::allocator(&local_7a);
  __l._M_len = sStack_70;
  __l._M_array = local_78;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->crc32s,__l,&local_79,&local_7a);
  std::allocator<unsigned_int>::~allocator(&local_7a);
  sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (&this->crc32s);
  bVar3 = false;
  if (sVar1 == 1) {
    local_88._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                   (&this->crc32s);
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_88);
    bVar3 = *puVar2 == 0;
  }
  if (bVar3) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              (&this->crc32s);
  }
  return;
}

Assistant:

Description(
			Name name, std::string machine_name, std::string descriptive_name, FileNameT file_names, size_t size, CRC32T crc32s = uint32_t(0)
		) : name{name}, machine_name{machine_name}, descriptive_name{descriptive_name}, file_names{file_names}, size{size}, crc32s{crc32s} {
			// Slightly lazy: deal with the case where the constructor wasn't provided with any
			// CRCs by spotting that the set has exactly one member, which has value 0. The alternative
			// would be to provide a partial specialisation that never put anything into the set.
			if(this->crc32s.size() == 1 && !*this->crc32s.begin()) {
				this->crc32s.clear();
			}
		}